

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed,MessageLite *prototype)

{
  ExtensionInfo info_00;
  bool bVar1;
  LogMessage *other;
  undefined1 local_90 [8];
  ExtensionInfo info;
  LogMessage local_58;
  MessageLite *local_20;
  MessageLite *prototype_local;
  bool is_packed_local;
  bool is_repeated_local;
  FieldType type_local;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *containing_type_local;
  
  bVar1 = false;
  local_20 = prototype;
  prototype_local._1_1_ = is_packed;
  prototype_local._2_1_ = is_repeated;
  prototype_local._3_1_ = type;
  prototype_local._4_4_ = number;
  pMStack_10 = containing_type;
  if ((type != '\v') && (type != '\n')) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x98);
    bVar1 = true;
    other = LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: type == WireFormatLite::TYPE_MESSAGE || type == WireFormatLite::TYPE_GROUP: "
                      );
    LogFinisher::operator=((LogFinisher *)((long)&info.descriptor + 3),other);
  }
  if (bVar1) {
    LogMessage::~LogMessage(&local_58);
  }
  ExtensionInfo::ExtensionInfo
            ((ExtensionInfo *)local_90,prototype_local._3_1_,(bool)(prototype_local._2_1_ & 1),
             (bool)(prototype_local._1_1_ & 1));
  info._0_8_ = local_20;
  info_00.field_3.enum_validity_check.func = (EnumValidityFuncWithArg *)local_20;
  info_00.type = local_90[0];
  info_00.is_repeated = (bool)local_90[1];
  info_00.is_packed = (bool)local_90[2];
  info_00._3_5_ = local_90._3_5_;
  info_00.field_3.enum_validity_check.arg = info.field_3.enum_validity_check.func;
  info_00.descriptor = (FieldDescriptor *)info.field_3.enum_validity_check.arg;
  anon_unknown_0::Register(pMStack_10,prototype_local._4_4_,info_00);
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* containing_type,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype) {
  GOOGLE_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
        type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(type, is_repeated, is_packed);
  info.message_prototype = prototype;
  Register(containing_type, number, info);
}